

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O3

bool __thiscall QOpenGL2PaintEngineEx::begin(QOpenGL2PaintEngineEx *this,QPaintDevice *pdev)

{
  QOpenGLBuffer *pQVar1;
  QOpenGLVertexArrayObject *this_00;
  long lVar2;
  int *piVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  QOpenGLContext *pQVar8;
  QOpenGLContext *pQVar9;
  long lVar10;
  QObject *pQVar11;
  undefined8 uVar12;
  QSize QVar13;
  QOpenGLEngineShaderManager *this_01;
  long lVar14;
  socklen_t __len;
  long lVar15;
  sockaddr *__addr;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x18;
  *(QPaintDevice **)(lVar2 + 0x238) = pdev;
  if (pdev != (QPaintDevice *)0x0) {
    (**(code **)(*(long *)pdev + 0x40))(pdev);
    pQVar8 = QOpenGLPaintDevice::context(*(QOpenGLPaintDevice **)(lVar2 + 0x238));
    pQVar9 = (QOpenGLContext *)QOpenGLContext::currentContext();
    if ((pQVar8 == pQVar9) &&
       (pQVar8 = QOpenGLPaintDevice::context(*(QOpenGLPaintDevice **)(lVar2 + 0x238)),
       pQVar8 != (QOpenGLContext *)0x0)) {
      lVar10 = QOpenGLContext::currentContext();
      lVar14 = *(long *)(lVar2 + 0x248);
      if (lVar14 == 0) {
        if (lVar10 == 0) goto LAB_001475c3;
LAB_00147582:
        QOpenGLBuffer::destroy((QOpenGLBuffer *)(lVar2 + 0x408));
        QOpenGLBuffer::destroy((QOpenGLBuffer *)(lVar2 + 0x410));
        QOpenGLBuffer::destroy((QOpenGLBuffer *)(lVar2 + 0x418));
        QOpenGLBuffer::destroy((QOpenGLBuffer *)(lVar2 + 0x420));
        QOpenGLVertexArrayObject::destroy((QOpenGLVertexArrayObject *)(lVar2 + 0x3f8));
      }
      else {
        if (*(int *)(lVar14 + 4) == 0) {
          lVar15 = 0;
        }
        else {
          lVar15 = *(long *)(lVar2 + 0x250);
        }
        if (lVar15 != lVar10) goto LAB_00147582;
        if (((*(int *)(lVar14 + 4) != 0) && (*(long *)(lVar2 + 0x250) != 0)) &&
           (lVar14 = QOpenGLContext::currentContext(), lVar14 != 0)) {
          QOpenGLContext::format();
          QOpenGLContext::currentContext();
          QOpenGLContext::format();
          cVar6 = QSurfaceFormat::equals((QSurfaceFormat *)&local_48);
          QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_38);
          QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_48);
          if (cVar6 == '\0') goto LAB_00147582;
        }
      }
LAB_001475c3:
      pQVar11 = (QObject *)QOpenGLContext::currentContext();
      if (pQVar11 == (QObject *)0x0) {
        uVar12 = 0;
      }
      else {
        uVar12 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar11);
      }
      piVar3 = *(int **)(lVar2 + 0x248);
      *(undefined8 *)(lVar2 + 0x248) = uVar12;
      *(QObject **)(lVar2 + 0x250) = pQVar11;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          operator_delete(piVar3);
        }
        pQVar11 = *(QObject **)(lVar2 + 0x250);
      }
      *(QOpenGL2PaintEngineEx **)(*(long *)(pQVar11 + 8) + 0x100) = this;
      (**(code **)(**(long **)(*(long *)(lVar2 + 0x238) + 0x10) + 0x10))();
      QOpenGLFunctions::initializeOpenGLFunctions();
      QOpenGLContext::format();
      iVar7 = QSurfaceFormat::profile();
      if (iVar7 == 1) {
        iVar7 = (int)*(undefined8 *)(lVar2 + 0x250);
        QOpenGLContext::format();
        uVar12 = QSurfaceFormat::version();
        if ((int)uVar12 < 3) {
          QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_38);
          goto LAB_001476a6;
        }
        __len = (socklen_t)((ulong)uVar12 >> 0x20);
        bVar4 = 1 < (int)__len;
        QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_38);
        QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_48);
        if (bVar4 || (int)uVar12 != 3) {
          this_00 = (QOpenGLVertexArrayObject *)(lVar2 + 0x3f8);
          bVar4 = QOpenGLVertexArrayObject::isCreated(this_00);
          if ((!bVar4) && (bVar4 = QOpenGLVertexArrayObject::create(this_00), bVar4)) {
            QOpenGLVertexArrayObject::bind(this_00,iVar7,__addr,__len);
          }
        }
      }
      else {
LAB_001476a6:
        QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_48);
      }
      pQVar1 = (QOpenGLBuffer *)(lVar2 + 0x408);
      bVar4 = QOpenGLBuffer::isCreated(pQVar1);
      if (!bVar4) {
        QOpenGLBuffer::create(pQVar1);
        QOpenGLBuffer::setUsagePattern(pQVar1,StreamDraw);
      }
      pQVar1 = (QOpenGLBuffer *)(lVar2 + 0x410);
      bVar4 = QOpenGLBuffer::isCreated(pQVar1);
      if (!bVar4) {
        QOpenGLBuffer::create(pQVar1);
        QOpenGLBuffer::setUsagePattern(pQVar1,StreamDraw);
      }
      pQVar1 = (QOpenGLBuffer *)(lVar2 + 0x418);
      bVar4 = QOpenGLBuffer::isCreated(pQVar1);
      if (!bVar4) {
        QOpenGLBuffer::create(pQVar1);
        QOpenGLBuffer::setUsagePattern(pQVar1,StreamDraw);
      }
      pQVar1 = (QOpenGLBuffer *)(lVar2 + 0x420);
      bVar4 = QOpenGLBuffer::isCreated(pQVar1);
      if (!bVar4) {
        QOpenGLBuffer::create(pQVar1);
        QOpenGLBuffer::setUsagePattern(pQVar1,StreamDraw);
      }
      *(undefined1 *)(lVar2 + 0x262) = 0;
      *(undefined2 *)(lVar2 + 0x260) = 0;
      QVar13 = QOpenGLPaintDevice::size(*(QOpenGLPaintDevice **)(lVar2 + 0x238));
      *(int *)(lVar2 + 0x240) = QVar13.wd.m_i.m_i;
      *(int *)(lVar2 + 0x244) = QVar13.ht.m_i.m_i;
      *(undefined4 *)(lVar2 + 600) = 2;
      *(undefined1 *)(lVar2 + 0x428) = 1;
      *(undefined4 *)(lVar2 + 0x263) = 0x1010101;
      *(undefined2 *)(lVar2 + 0x267) = 0x101;
      QPaintEngine::systemClip();
      bVar5 = QRegion::isEmpty();
      *(byte *)(lVar2 + 0x26a) = bVar5 ^ 1;
      QRegion::~QRegion((QRegion *)&local_48);
      QBrush::QBrush((QBrush *)&local_48);
      uVar12 = *(undefined8 *)(lVar2 + 0x290);
      *(undefined8 *)(lVar2 + 0x290) = local_48;
      local_48 = uVar12;
      QBrush::~QBrush((QBrush *)&local_48);
      local_48 = 0;
      local_40 = CONCAT44((int)((ulong)*(undefined8 *)(lVar2 + 0x240) >> 0x20) + -1,
                          (int)*(undefined8 *)(lVar2 + 0x240) + -1);
      pQVar8 = (QOpenGLContext *)0x0;
      QRegion::QRegion((QRegion *)&local_38,&local_48,0);
      uVar12 = *(undefined8 *)(lVar2 + 0x270);
      *(undefined8 *)(lVar2 + 0x270) = local_38;
      local_38 = uVar12;
      QRegion::~QRegion((QRegion *)&local_38);
      *(undefined1 *)(lVar2 + 0x269) = 1;
      this_01 = (QOpenGLEngineShaderManager *)operator_new(0x98);
      if (*(long *)(lVar2 + 0x248) != 0) {
        if (*(int *)(*(long *)(lVar2 + 0x248) + 4) == 0) {
          pQVar8 = (QOpenGLContext *)0x0;
        }
        else {
          pQVar8 = *(QOpenGLContext **)(lVar2 + 0x250);
        }
      }
      QOpenGLEngineShaderManager::QOpenGLEngineShaderManager(this_01,pQVar8);
      *(QOpenGLEngineShaderManager **)(lVar2 + 0x230) = this_01;
      (**(code **)(*(long *)(lVar2 + 0x220) + 0x70))(0xb90);
      (**(code **)(*(long *)(lVar2 + 0x220) + 0x70))(0xb71);
      (**(code **)(*(long *)(lVar2 + 0x220) + 0x70))(0xc11);
      *(undefined4 *)(lVar2 + 0x25c) = 2;
      QOpenGLContext::currentContext();
      cVar6 = QOpenGLContext::isOpenGLES();
      if (cVar6 == '\0') {
        (**(code **)(*(long *)(lVar2 + 0x220) + 0x70))(0x809d);
        *(undefined4 *)(lVar2 + 0x25c) = 3;
        *(undefined1 *)(lVar2 + 0x429) = 0;
      }
      else {
        QOpenGLPaintDevice::context(*(QOpenGLPaintDevice **)(lVar2 + 0x238));
        QOpenGLContext::format();
        iVar7 = QSurfaceFormat::samples();
        *(bool *)(lVar2 + 0x429) = 1 < iVar7;
        QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_48);
      }
      bVar4 = true;
      goto LAB_00147a4e;
    }
    begin();
  }
  bVar4 = false;
LAB_00147a4e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QOpenGL2PaintEngineEx::begin(QPaintDevice *pdev)
{
    Q_D(QOpenGL2PaintEngineEx);

    Q_ASSERT(pdev->devType() == QInternal::OpenGL);
    d->device = static_cast<QOpenGLPaintDevice*>(pdev);

    if (!d->device)
        return false;

    d->device->ensureActiveTarget();

    if (d->device->context() != QOpenGLContext::currentContext() || !d->device->context()) {
        qWarning("QPainter::begin(): QOpenGLPaintDevice's context needs to be current");
        return false;
    }

    if (d->ctx != QOpenGLContext::currentContext()
            || (d->ctx && QOpenGLContext::currentContext() && d->ctx->format() != QOpenGLContext::currentContext()->format())) {
        d->vertexBuffer.destroy();
        d->texCoordBuffer.destroy();
        d->opacityBuffer.destroy();
        d->indexBuffer.destroy();
        d->vao.destroy();
    }

    d->ctx = QOpenGLContext::currentContext();
    d->ctx->d_func()->active_engine = this;

    QOpenGLPaintDevicePrivate::get(d->device)->beginPaint();

    d->funcs.initializeOpenGLFunctions();

    // Generate a new Vertex Array Object if we don't have one already.  We can
    // only hit the VAO-based path when using a core profile context.  This is
    // because while non-core contexts can support VAOs via extensions, legacy
    // components like the QtOpenGL module do not know about VAOs. There are
    // still tests for QGL-QOpenGL paint engine interoperability, so keep the
    // status quo for now, and avoid introducing a VAO in non-core contexts.
    const bool needsVAO = d->ctx->format().profile() == QSurfaceFormat::CoreProfile
        && d->ctx->format().version() >= std::pair(3, 2);
    if (needsVAO && !d->vao.isCreated()) {
        bool created = d->vao.create();

        // If we managed to create it then we have a profile that supports VAOs
        if (created)
            d->vao.bind();
    }

    // Generate a new Vertex Buffer Object if we don't have one already
    if (!d->vertexBuffer.isCreated()) {
        d->vertexBuffer.create();
        // Set its usage to StreamDraw, we will use this buffer only a few times before refilling it
        d->vertexBuffer.setUsagePattern(QOpenGLBuffer::StreamDraw);
    }
    if (!d->texCoordBuffer.isCreated()) {
        d->texCoordBuffer.create();
        d->texCoordBuffer.setUsagePattern(QOpenGLBuffer::StreamDraw);
    }
    if (!d->opacityBuffer.isCreated()) {
        d->opacityBuffer.create();
        d->opacityBuffer.setUsagePattern(QOpenGLBuffer::StreamDraw);
    }
    if (!d->indexBuffer.isCreated()) {
        d->indexBuffer.create();
        d->indexBuffer.setUsagePattern(QOpenGLBuffer::StreamDraw);
    }

    for (int i = 0; i < QT_GL_VERTEX_ARRAY_TRACKED_COUNT; ++i)
        d->vertexAttributeArraysEnabledState[i] = false;

    const QSize sz = d->device->size();
    d->width = sz.width();
    d->height = sz.height();
    d->mode = BrushDrawingMode;
    d->brushTextureDirty = true;
    d->brushUniformsDirty = true;
    d->matrixUniformDirty = true;
    d->matrixDirty = true;
    d->compositionModeDirty = true;
    d->opacityUniformDirty = true;
    d->needsSync = true;
    d->useSystemClip = !systemClip().isEmpty();
    d->currentBrush = QBrush();

    d->dirtyStencilRegion = QRect(0, 0, d->width, d->height);
    d->stencilClean = true;

    d->shaderManager = new QOpenGLEngineShaderManager(d->ctx);

    d->funcs.glDisable(GL_STENCIL_TEST);
    d->funcs.glDisable(GL_DEPTH_TEST);
    d->funcs.glDisable(GL_SCISSOR_TEST);

    d->glyphCacheFormat = QFontEngine::Format_A8;

#if !QT_CONFIG(opengles2)
    if (!QOpenGLContext::currentContext()->isOpenGLES()) {
        d->funcs.glDisable(GL_MULTISAMPLE);
        d->glyphCacheFormat = QFontEngine::Format_A32;
        d->multisamplingAlwaysEnabled = false;
    } else
#endif // !QT_CONFIG(opengles2)
    {
        // OpenGL ES can't switch MSAA off, so if the gl paint device is
        // multisampled, it's always multisampled.
        d->multisamplingAlwaysEnabled = d->device->context()->format().samples() > 1;
    }

    return true;
}